

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_newclass(HSQUIRRELVM v,SQBool hasbase)

{
  SQBool this;
  SQRESULT SVar1;
  SQObjectPtr local_48;
  SQClass *local_38;
  SQClass *newclass;
  SQObjectPtr *base;
  SQClass *baseclass;
  SQBool hasbase_local;
  HSQUIRRELVM v_local;
  
  base = (SQObjectPtr *)0x0;
  baseclass = (SQClass *)hasbase;
  hasbase_local = (SQBool)v;
  if (hasbase != 0) {
    newclass = (SQClass *)stack_get(v,-1);
    if (*(SQObjectType *)&(newclass->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted !=
        OT_CLASS) {
      SVar1 = sq_throwerror((HSQUIRRELVM)hasbase_local,"invalid base type");
      return SVar1;
    }
    base = (SQObjectPtr *)
           ((SQObjectValue *)&(newclass->super_SQCollectable).super_SQRefCounted._uiRef)->pTable;
  }
  local_38 = SQClass::Create(*(SQSharedState **)(hasbase_local + 0x118),(SQClass *)base);
  if (base != (SQObjectPtr *)0x0) {
    SQVM::Pop((SQVM *)hasbase_local);
  }
  this = hasbase_local;
  SQObjectPtr::SQObjectPtr(&local_48,local_38);
  SQVM::Push((SQVM *)this,&local_48);
  SQObjectPtr::~SQObjectPtr(&local_48);
  return 0;
}

Assistant:

SQRESULT sq_newclass(HSQUIRRELVM v,SQBool hasbase)
{
    SQClass *baseclass = NULL;
    if(hasbase) {
        SQObjectPtr &base = stack_get(v,-1);
        if(type(base) != OT_CLASS)
            return sq_throwerror(v,_SC("invalid base type"));
        baseclass = _class(base);
    }
    SQClass *newclass = SQClass::Create(_ss(v), baseclass);
    if(baseclass) v->Pop();
    v->Push(newclass);
    return SQ_OK;
}